

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void do_cas2l(CPUM68KState_conflict *env,uint32_t regs,uint32_t a1,uint32_t a2,_Bool parallel)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t val;
  uint32_t uVar4;
  uint32_t uVar5;
  CPUM68KState_conflict *__mptr;
  uint uVar6;
  undefined3 in_register_00000081;
  uint uVar7;
  uintptr_t unaff_retaddr;
  
  if (CONCAT31(in_register_00000081,parallel) != 0) {
    cpu_loop_exit_atomic_m68k((CPUState *)(env[-0x40].fregs + 2),unaff_retaddr);
  }
  uVar6 = regs >> 9 & 7;
  uVar7 = regs >> 6 & 7;
  uVar1 = env->dregs[uVar6];
  uVar2 = env->dregs[uVar7];
  uVar3 = *(uint32_t *)((long)env->dregs + (ulong)(regs >> 1 & 0x1c));
  val = env->dregs[regs & 7];
  uVar4 = cpu_ldl_data_ra_m68k(env,a1,unaff_retaddr);
  uVar5 = cpu_ldl_data_ra_m68k(env,a2,unaff_retaddr);
  if ((uVar4 == uVar1) && (uVar5 == uVar2)) {
    cpu_stl_data_ra_m68k(env,a1,uVar3,unaff_retaddr);
    cpu_stl_data_ra_m68k(env,a2,val,unaff_retaddr);
  }
  uVar3 = uVar5;
  if (uVar4 != uVar1) {
    uVar2 = uVar1;
    uVar3 = uVar4;
  }
  env->cc_n = uVar3;
  env->cc_v = uVar2;
  env->cc_op = 10;
  env->dregs[uVar6] = uVar4;
  env->dregs[uVar7] = uVar5;
  return;
}

Assistant:

static void do_cas2l(CPUM68KState *env, uint32_t regs, uint32_t a1, uint32_t a2,
                     bool parallel)
{
    uint32_t Dc1 = extract32(regs, 9, 3);
    uint32_t Dc2 = extract32(regs, 6, 3);
    uint32_t Du1 = extract32(regs, 3, 3);
    uint32_t Du2 = extract32(regs, 0, 3);
    uint32_t c1 = env->dregs[Dc1];
    uint32_t c2 = env->dregs[Dc2];
    uint32_t u1 = env->dregs[Du1];
    uint32_t u2 = env->dregs[Du2];
    uint32_t l1, l2;
    uintptr_t ra = GETPC();
#if defined(CONFIG_ATOMIC64)
    int mmu_idx = cpu_mmu_index(env, 0);
    TCGMemOpIdx oi;
#endif

    if (parallel) {
        /* We're executing in a parallel context -- must be atomic.  */
#ifdef CONFIG_ATOMIC64
        uint64_t c, u, l;
        if ((a1 & 7) == 0 && a2 == a1 + 4) {
            c = deposit64(c2, 32, 32, c1);
            u = deposit64(u2, 32, 32, u1);
            oi = make_memop_idx(MO_BEQ, mmu_idx);
            l = helper_atomic_cmpxchgq_be_mmu(env, a1, c, u, oi, ra);
            l1 = l >> 32;
            l2 = l;
        } else if ((a2 & 7) == 0 && a1 == a2 + 4) {
            c = deposit64(c1, 32, 32, c2);
            u = deposit64(u1, 32, 32, u2);
            oi = make_memop_idx(MO_BEQ, mmu_idx);
            l = helper_atomic_cmpxchgq_be_mmu(env, a2, c, u, oi, ra);
            l2 = l >> 32;
            l1 = l;
        } else
#endif
        {
            /* Tell the main loop we need to serialize this insn.  */
            cpu_loop_exit_atomic(env_cpu(env), ra);
        }
    } else {
        /* We're executing in a serial context -- no need to be atomic.  */
        l1 = cpu_ldl_data_ra(env, a1, ra);
        l2 = cpu_ldl_data_ra(env, a2, ra);
        if (l1 == c1 && l2 == c2) {
            cpu_stl_data_ra(env, a1, u1, ra);
            cpu_stl_data_ra(env, a2, u2, ra);
        }
    }

    if (c1 != l1) {
        env->cc_n = l1;
        env->cc_v = c1;
    } else {
        env->cc_n = l2;
        env->cc_v = c2;
    }
    env->cc_op = CC_OP_CMPL;
    env->dregs[Dc1] = l1;
    env->dregs[Dc2] = l2;
}